

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_avx2_256_16.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_table_scan_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  ushort uVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  ulong uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  __m256i alVar14;
  short sVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  parasail_result_t *ppVar19;
  __m256i *ptr;
  int16_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  ulong uVar20;
  __m256i *palVar21;
  uint uVar22;
  int iVar23;
  __m256i *palVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  int iVar31;
  undefined4 uVar32;
  short sVar33;
  uint uVar34;
  uint uVar35;
  ulong size;
  bool bVar36;
  undefined2 uVar37;
  undefined2 uVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  int local_2b4;
  long local_2a0;
  int local_298;
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  undefined1 local_138 [32];
  undefined1 auVar53 [32];
  undefined1 auVar65 [64];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_scan_profile_avx2_256_16_cold_8();
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sg_flags_table_scan_profile_avx2_256_16_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_scan_profile_avx2_256_16_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sg_flags_table_scan_profile_avx2_256_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_scan_profile_avx2_256_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_table_scan_profile_avx2_256_16_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_table_scan_profile_avx2_256_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_table_scan_profile_avx2_256_16_cold_1();
        }
        else {
          uVar16 = uVar3 - 1;
          uVar25 = (ulong)uVar3 + 0xf;
          size = uVar25 >> 4;
          uVar7 = (ulong)uVar16 % size;
          iVar17 = (int)(uVar16 / size);
          local_138._4_4_ = -open;
          iVar18 = ppVar5->min;
          iVar23 = -iVar18;
          if (iVar18 != local_138._4_4_ && SBORROW4(iVar18,local_138._4_4_) == iVar18 + open < 0) {
            iVar23 = open;
          }
          sVar15 = 0x7ffe - (short)ppVar5->max;
          ppVar19 = parasail_result_new_table1((uint)uVar25 & 0x7ffffff0,s2Len);
          if (ppVar19 != (parasail_result_t *)0x0) {
            ppVar19->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar19->flag | 0x10220402;
            ptr = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign_int16_t(0x20,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m256i(0x20,size);
            ptr_02 = parasail_memalign___m256i(0x20,size);
            ptr_03 = parasail_memalign___m256i(0x20,size);
            if (ptr_03 != (__m256i *)0x0 &&
                ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                (ptr_00 != (int16_t *)0x0 && ptr != (__m256i *)0x0))) {
              iVar18 = s2Len + -1;
              iVar31 = 0xf - iVar17;
              uVar37 = (undefined2)open;
              auVar44._2_2_ = uVar37;
              auVar44._0_2_ = uVar37;
              auVar44._4_2_ = uVar37;
              auVar44._6_2_ = uVar37;
              auVar44._8_2_ = uVar37;
              auVar44._10_2_ = uVar37;
              auVar44._12_2_ = uVar37;
              auVar44._14_2_ = uVar37;
              auVar44._16_2_ = uVar37;
              auVar44._18_2_ = uVar37;
              auVar44._20_2_ = uVar37;
              auVar44._22_2_ = uVar37;
              auVar44._24_2_ = uVar37;
              auVar44._26_2_ = uVar37;
              auVar44._28_2_ = uVar37;
              auVar44._30_2_ = uVar37;
              uVar37 = (undefined2)gap;
              auVar45._2_2_ = uVar37;
              auVar45._0_2_ = uVar37;
              auVar45._4_2_ = uVar37;
              auVar45._6_2_ = uVar37;
              auVar45._8_2_ = uVar37;
              auVar45._10_2_ = uVar37;
              auVar45._12_2_ = uVar37;
              auVar45._14_2_ = uVar37;
              auVar45._16_2_ = uVar37;
              auVar45._18_2_ = uVar37;
              auVar45._20_2_ = uVar37;
              auVar45._22_2_ = uVar37;
              auVar45._24_2_ = uVar37;
              auVar45._26_2_ = uVar37;
              auVar45._28_2_ = uVar37;
              auVar45._30_2_ = uVar37;
              uVar34 = iVar23 - 0x7fff;
              uVar37 = (undefined2)uVar34;
              uVar38 = (undefined2)iVar31;
              uVar35 = (uint)size;
              auVar39._0_2_ = (undefined2)-(uVar35 * gap);
              auVar39._2_2_ = auVar39._0_2_;
              auVar39._4_2_ = auVar39._0_2_;
              auVar39._6_2_ = auVar39._0_2_;
              auVar39._8_2_ = auVar39._0_2_;
              auVar39._10_2_ = auVar39._0_2_;
              auVar39._12_2_ = auVar39._0_2_;
              auVar39._14_2_ = auVar39._0_2_;
              auVar39._16_2_ = auVar39._0_2_;
              auVar39._18_2_ = auVar39._0_2_;
              auVar39._20_2_ = auVar39._0_2_;
              auVar39._22_2_ = auVar39._0_2_;
              auVar39._24_2_ = auVar39._0_2_;
              auVar39._26_2_ = auVar39._0_2_;
              auVar39._28_2_ = auVar39._0_2_;
              auVar39._30_2_ = auVar39._0_2_;
              auVar39 = vpand_avx2(auVar39,_DAT_00908de0);
              auVar39 = vpaddsw_avx2(ZEXT432(uVar34 & 0xffff),auVar39);
              bVar36 = s1_beg != 0;
              auVar46._4_4_ = 0;
              auVar46._0_4_ = open;
              auVar40._4_4_ = 0;
              auVar40._0_4_ = gap;
              lVar27 = (long)(int)local_138._4_4_;
              auVar40._8_4_ = gap;
              auVar40._12_4_ = 0;
              auVar40._16_4_ = gap;
              auVar40._20_4_ = 0;
              auVar40._24_4_ = gap;
              auVar40._28_4_ = 0;
              auVar42._8_8_ = lVar27;
              auVar42._0_8_ = lVar27;
              auVar42._16_8_ = lVar27;
              auVar42._24_8_ = lVar27;
              auVar46._8_4_ = open;
              auVar46._12_4_ = 0;
              auVar46._16_4_ = open;
              auVar46._20_4_ = 0;
              auVar46._24_4_ = open;
              auVar46._28_4_ = 0;
              auVar43._8_8_ = size;
              auVar43._0_8_ = size;
              auVar43._16_8_ = size;
              auVar43._24_8_ = size;
              auVar53 = vpmuldq_avx2(auVar43,_DAT_00908e00);
              auVar59 = vpmuldq_avx2(auVar43,_DAT_00908e20);
              auVar56 = vpmuldq_avx2(auVar43,_DAT_00908c60);
              auVar55 = vpmuldq_avx2(auVar43,_DAT_00908b60);
              auVar50._0_4_ = CONCAT13(bVar36,CONCAT12(bVar36,CONCAT11(bVar36,bVar36)));
              auVar50[4] = bVar36;
              auVar50[5] = bVar36;
              auVar50[6] = bVar36;
              auVar50[7] = bVar36;
              auVar50[8] = bVar36;
              auVar50[9] = bVar36;
              auVar50[10] = bVar36;
              auVar50[0xb] = bVar36;
              auVar50[0xc] = bVar36;
              auVar50[0xd] = bVar36;
              auVar50[0xe] = bVar36;
              auVar50[0xf] = bVar36;
              auVar48 = vpshufb_avx(auVar50,_DAT_00904a90);
              uVar20 = 0;
              auVar48 = vpslld_avx(auVar48,0x1f);
              auVar48 = vpsrad_avx(auVar48,0x1f);
              auVar43 = vpmovsxdq_avx2(auVar48);
              auVar48 = vpshufb_avx(auVar50,_DAT_00904b80);
              auVar48 = vpslld_avx(auVar48,0x1f);
              auVar48 = vpsrad_avx(auVar48,0x1f);
              auVar11 = vpmovsxdq_avx2(auVar48);
              auVar48 = vpshufb_avx(auVar50,_DAT_00904b90);
              auVar48 = vpslld_avx(auVar48,0x1f);
              auVar48 = vpsrad_avx(auVar48,0x1f);
              auVar61 = vpmovsxdq_avx2(auVar48);
              auVar62._8_8_ = 0xffffffffffff8000;
              auVar62._0_8_ = 0xffffffffffff8000;
              auVar62._16_8_ = 0xffffffffffff8000;
              auVar62._24_8_ = 0xffffffffffff8000;
              palVar21 = ptr_02;
              palVar24 = ptr;
              do {
                auVar49._8_8_ = uVar20;
                auVar49._0_8_ = uVar20;
                auVar49._16_8_ = uVar20;
                auVar49._24_8_ = uVar20;
                auVar52 = vpaddq_avx2(auVar49,auVar53);
                auVar54 = vpaddq_avx2(auVar49,auVar59);
                auVar58 = vpaddq_avx2(auVar49,auVar55);
                auVar49 = vpaddq_avx2(auVar49,auVar56);
                auVar12 = vpmuludq_avx2(auVar49,auVar40);
                auVar49 = vpsrlq_avx2(auVar49,0x20);
                auVar49 = vpmuludq_avx2(auVar49,auVar40);
                auVar49 = vpsllq_avx2(auVar49,0x20);
                auVar49 = vpaddq_avx2(auVar12,auVar49);
                auVar12 = vpmuludq_avx2(auVar58,auVar40);
                auVar58 = vpsrlq_avx2(auVar58,0x20);
                auVar58 = vpmuludq_avx2(auVar58,auVar40);
                auVar58 = vpsllq_avx2(auVar58,0x20);
                auVar58 = vpaddq_avx2(auVar58,auVar12);
                auVar12 = vpmuludq_avx2(auVar54,auVar40);
                auVar54 = vpsrlq_avx2(auVar54,0x20);
                auVar54 = vpmuludq_avx2(auVar54,auVar40);
                auVar54 = vpsllq_avx2(auVar54,0x20);
                auVar54 = vpaddq_avx2(auVar54,auVar12);
                auVar12 = vpmuludq_avx2(auVar52,auVar40);
                auVar52 = vpsrlq_avx2(auVar52,0x20);
                auVar52 = vpmuludq_avx2(auVar52,auVar40);
                auVar52 = vpsllq_avx2(auVar52,0x20);
                auVar52 = vpaddq_avx2(auVar12,auVar52);
                auVar52 = vpsubq_avx2(auVar42,auVar52);
                auVar8 = vpandn_avx2(auVar61,auVar52);
                auVar12 = vpsubq_avx2(auVar42,auVar54);
                auVar58 = vpsubq_avx2(auVar42,auVar58);
                auVar13 = vpsubq_avx2(auVar42,auVar49);
                auVar48 = vpmovzxbd_avx(ZEXT416(auVar50._0_4_));
                auVar48 = vpslld_avx(auVar48,0x1f);
                auVar48 = vpsrad_avx(auVar48,0x1f);
                auVar54 = vpmovsxdq_avx2(auVar48);
                auVar52 = vpcmpgtq_avx2(auVar8,auVar62);
                auVar52 = vblendvpd_avx(auVar62,auVar8,auVar52);
                auVar49 = vpandn_avx2(auVar54,auVar58);
                auVar54 = vpcmpgtq_avx2(auVar49,auVar62);
                auVar54 = vblendvpd_avx(auVar62,auVar49,auVar54);
                auVar9 = vpandn_avx2(auVar43,auVar13);
                auVar58 = vpcmpgtq_avx2(auVar9,auVar62);
                auVar58 = vblendvpd_avx(auVar62,auVar9,auVar58);
                auVar10 = vpandn_avx2(auVar11,auVar12);
                auVar64 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                auVar58 = vpblendw_avx2(auVar64,auVar58,0x11);
                auVar54 = vpblendw_avx2(auVar64,auVar54,0x11);
                auVar12 = vpackusdw_avx2(auVar54,auVar58);
                auVar54 = vpcmpgtq_avx2(auVar10,auVar62);
                auVar54 = vblendvpd_avx(auVar62,auVar10,auVar54);
                auVar54 = vpblendw_avx2(auVar64,auVar54,0x11);
                auVar52 = vpblendw_avx2(auVar64,auVar52,0x11);
                auVar13 = vpackusdw_avx2(auVar54,auVar52);
                auVar9 = vpsubq_avx2(auVar9,auVar46);
                auVar49 = vpsubq_avx2(auVar49,auVar46);
                auVar54 = vpsubq_avx2(auVar8,auVar46);
                auVar52 = vpcmpgtq_avx2(auVar54,auVar62);
                auVar52 = vblendvpd_avx(auVar62,auVar54,auVar52);
                auVar58 = vpsubq_avx2(auVar10,auVar46);
                auVar54 = vpcmpgtq_avx2(auVar58,auVar62);
                auVar54 = vblendvpd_avx(auVar62,auVar58,auVar54);
                auVar58 = vpcmpgtq_avx2(auVar49,auVar62);
                auVar58 = vblendvpd_avx(auVar62,auVar49,auVar58);
                auVar49 = vpcmpgtq_avx2(auVar9,auVar62);
                auVar49 = vblendvpd_avx(auVar62,auVar9,auVar49);
                auVar12 = vpermq_avx2(auVar12,0xd8);
                auVar13 = vpermq_avx2(auVar13,0xd8);
                auVar12 = vpackusdw_avx2(auVar12,auVar13);
                auVar49 = vpblendw_avx2(auVar64,auVar49,0x11);
                auVar58 = vpblendw_avx2(auVar64,auVar58,0x11);
                auVar58 = vpackusdw_avx2(auVar58,auVar49);
                auVar57 = ZEXT3264(auVar58);
                auVar54 = vpblendw_avx2(auVar64,auVar54,0x11);
                auVar52 = vpblendw_avx2(auVar64,auVar52,0x11);
                auVar52 = vpackusdw_avx2(auVar54,auVar52);
                alVar14 = (__m256i)vpermq_avx2(auVar12,0xd8);
                *palVar21 = alVar14;
                auVar54 = vpermq_avx2(auVar58,0xd8);
                auVar52 = vpermq_avx2(auVar52,0xd8);
                auVar52 = vpackusdw_avx2(auVar54,auVar52);
                alVar14 = (__m256i)vpermq_avx2(auVar52,0xd8);
                *palVar24 = alVar14;
                uVar20 = uVar20 + 1;
                palVar24 = palVar24 + 1;
                palVar21 = palVar21 + 1;
              } while (size != uVar20);
              *ptr_00 = 0;
              uVar20 = (ulong)(uint)s2Len;
              lVar27 = uVar20 - 1;
              auVar51._8_8_ = lVar27;
              auVar51._0_8_ = lVar27;
              auVar53._16_8_ = lVar27;
              auVar53._0_16_ = auVar51;
              auVar53._24_8_ = lVar27;
              local_1f8._4_4_ = gap;
              local_1f8._0_4_ = gap;
              local_1f8._8_4_ = gap;
              local_1f8._12_4_ = gap;
              local_1f8._16_4_ = gap;
              local_1f8._20_4_ = gap;
              local_1f8._24_4_ = gap;
              local_1f8._28_4_ = gap;
              local_138._0_4_ = local_138._4_4_;
              local_138._8_4_ = local_138._4_4_;
              local_138._12_4_ = local_138._4_4_;
              local_138._16_4_ = local_138._4_4_;
              local_138._20_4_ = local_138._4_4_;
              local_138._24_4_ = local_138._4_4_;
              local_138._28_4_ = local_138._4_4_;
              auVar11 = vpmovsxbd_avx2(ZEXT816(0x100f0e0d0c0b0a09));
              auVar43 = vpmovsxbd_avx2(ZEXT816(0x807060504030201));
              uVar30 = 0;
              auVar41._8_8_ = 0x8000000000000000;
              auVar41._0_8_ = 0x8000000000000000;
              auVar48 = vpcmpeqd_avx(alVar14._0_16_,alVar14._0_16_);
              auVar61 = vpcmpeqd_avx2(auVar46,auVar46);
              auVar47 = ZEXT3264(auVar61);
              auVar61._8_8_ = 0x8000000000000000;
              auVar61._0_8_ = 0x8000000000000000;
              auVar61._16_8_ = 0x8000000000000000;
              auVar61._24_8_ = 0x8000000000000000;
              auVar63._8_4_ = 4;
              auVar63._0_8_ = 0x400000004;
              auVar63._12_4_ = 4;
              auVar65 = ZEXT1664(auVar63);
              local_218._8_4_ = 0x10;
              local_218._0_8_ = 0x1000000010;
              local_218._12_4_ = 0x10;
              local_218._16_4_ = 0x10;
              local_218._20_4_ = 0x10;
              local_218._24_4_ = 0x10;
              local_218._28_4_ = 0x10;
              do {
                auVar59 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                if (s2_beg == 0) {
                  auVar55 = vpcmpeqd_avx2(auVar57._0_32_,auVar57._0_32_);
                  auVar56 = vpaddd_avx2(auVar43,auVar55);
                  auVar40 = vpcmpeqd_avx2(auVar47._0_32_,auVar47._0_32_);
                  auVar47 = ZEXT3264(auVar40);
                  auVar55 = vpaddd_avx2(auVar11,auVar55);
                  auVar55 = vpmulld_avx2(auVar55,local_1f8);
                  auVar56 = vpmulld_avx2(auVar56,local_1f8);
                  auVar56 = vpsubd_avx2(local_138,auVar56);
                  auVar55 = vpsubd_avx2(local_138,auVar55);
                  auVar52._8_4_ = 0xffff8000;
                  auVar52._0_8_ = 0xffff8000ffff8000;
                  auVar52._12_4_ = 0xffff8000;
                  auVar52._16_4_ = 0xffff8000;
                  auVar52._20_4_ = 0xffff8000;
                  auVar52._24_4_ = 0xffff8000;
                  auVar52._28_4_ = 0xffff8000;
                  auVar55 = vpmaxsd_avx2(auVar55,auVar52);
                  auVar56 = vpmaxsd_avx2(auVar56,auVar52);
                  auVar56 = vpblendw_avx2(auVar56,auVar59,0xaa);
                  auVar59 = vpblendw_avx2(auVar55,auVar59,0xaa);
                  auVar59 = vpackusdw_avx2(auVar56,auVar59);
                  auVar59 = vpermq_avx2(auVar59,0xd8);
                }
                auVar55._8_8_ = uVar30;
                auVar55._0_8_ = uVar30;
                auVar55._16_8_ = uVar30;
                auVar55._24_8_ = uVar30;
                auVar56 = vpor_avx2(auVar55,_DAT_00908b60);
                auVar50 = vpcmpgtq_avx(auVar56._0_16_ ^ auVar41,auVar51 ^ auVar41);
                auVar50 = vpackssdw_avx(auVar50,auVar50);
                auVar50 = vpackssdw_avx(auVar50 ^ auVar48,auVar50 ^ auVar48);
                auVar50 = vpacksswb_avx(auVar50,auVar50);
                auVar60 = auVar59._0_16_;
                if ((auVar50 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar60,0);
                }
                auVar50 = vpcmpgtq_avx(auVar56._0_16_ ^ auVar41,auVar51 ^ auVar41);
                auVar50 = vpackssdw_avx(auVar50,auVar50);
                auVar50 = vpackssdw_avx(auVar50 ^ auVar48,auVar50 ^ auVar48);
                auVar50 = vpacksswb_avx(auVar50,auVar50);
                if ((auVar50 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar60,1);
                }
                auVar42 = auVar61 ^ auVar53;
                auVar56 = vpcmpgtq_avx2(auVar56 ^ auVar61,auVar42);
                auVar40 = vpshuflw_avx2(auVar56,0xe8);
                auVar46 = auVar47._0_32_;
                auVar40 = vpermd_avx2(auVar65._0_32_,auVar40 ^ auVar46);
                auVar50 = vpackssdw_avx(auVar40._0_16_,auVar40._0_16_);
                auVar50 = vpacksswb_avx(auVar50,auVar50);
                if ((auVar50 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar60,2);
                }
                auVar50 = vpackssdw_avx(auVar56._16_16_,auVar56._16_16_);
                auVar50 = vpackssdw_avx(auVar50 ^ auVar48,auVar50 ^ auVar48);
                auVar50 = vpacksswb_avx(auVar50,auVar50);
                if ((auVar50 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar60,3);
                }
                auVar40 = vpor_avx2(auVar55,_DAT_00908c60);
                auVar50 = vpcmpgtq_avx(auVar40._0_16_ ^ auVar41,auVar51 ^ auVar41);
                auVar50 = vpackssdw_avx(auVar50,auVar50);
                auVar56 = vpermq_avx2(ZEXT1632(auVar50 ^ auVar48),0x55);
                auVar56 = vpackssdw_avx2(auVar56,auVar42);
                auVar50 = vpacksswb_avx(auVar56._16_16_,auVar56._16_16_);
                if ((auVar50 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar60,4);
                }
                auVar50 = vpcmpgtq_avx(auVar40._0_16_ ^ auVar41,auVar51 ^ auVar41);
                auVar50 = vpshufhw_avx(auVar50,0x84);
                auVar56 = vpermq_avx2(ZEXT1632(auVar50 ^ auVar48),0x55);
                auVar56 = vpackssdw_avx2(auVar56,auVar42);
                auVar50 = vpacksswb_avx(auVar56._16_16_,auVar56._16_16_);
                if ((auVar50 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar60,5);
                }
                auVar40 = vpcmpgtq_avx2(auVar40 ^ auVar61,auVar42);
                auVar56 = vpackssdw_avx2(auVar42,auVar40);
                auVar56 = vpackssdw_avx2(auVar56 ^ auVar46,auVar42);
                auVar50 = vpacksswb_avx(auVar56._16_16_,auVar56._16_16_);
                if ((auVar50 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar60,6);
                }
                auVar56 = vpackssdw_avx2(auVar42,auVar40);
                auVar56 = vpackssdw_avx2(auVar56 ^ auVar46,auVar42);
                auVar50 = vpacksswb_avx(auVar56._16_16_,auVar56._16_16_);
                if ((auVar50 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar60,7);
                }
                auVar56 = vpor_avx2(auVar55,_DAT_00908e20);
                auVar50 = vpcmpgtq_avx(auVar56._0_16_ ^ auVar41,auVar51 ^ auVar41);
                auVar50 = vpackssdw_avx(auVar50,auVar50);
                auVar50 = vpackssdw_avx(auVar50 ^ auVar48,auVar50 ^ auVar48);
                auVar50 = vpacksswb_avx(auVar50,auVar50);
                auVar60 = auVar59._16_16_;
                if ((auVar50 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar60,0);
                }
                auVar50 = vpcmpgtq_avx(auVar56._0_16_ ^ auVar41,auVar51 ^ auVar41);
                auVar50 = vpackssdw_avx(auVar50,auVar50);
                auVar50 = vpackssdw_avx(auVar50 ^ auVar48,auVar50 ^ auVar48);
                auVar50 = vpacksswb_avx(auVar50,auVar50);
                if ((auVar50 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar60,1);
                }
                auVar59 = vpcmpgtq_avx2(auVar56 ^ auVar61,auVar42);
                auVar56 = vpshuflw_avx2(auVar59,0xe8);
                auVar65 = ZEXT3264(ZEXT1632(auVar63));
                auVar56 = vpermd_avx2(ZEXT1632(auVar63),auVar56 ^ auVar46);
                auVar50 = vpackssdw_avx(auVar56._0_16_,auVar56._0_16_);
                auVar50 = vpacksswb_avx(auVar50,auVar50);
                if ((auVar50 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar60,2);
                }
                auVar50 = vpackssdw_avx(auVar59._16_16_,auVar59._16_16_);
                auVar50 = vpackssdw_avx(auVar50 ^ auVar48,auVar50 ^ auVar48);
                auVar50 = vpacksswb_avx(auVar50,auVar50);
                if ((auVar50 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar60,3);
                }
                auVar56 = vpor_avx2(auVar55,_DAT_00908e00);
                auVar50 = vpcmpgtq_avx(auVar56._0_16_ ^ auVar41,auVar51 ^ auVar41);
                auVar50 = vpackssdw_avx(auVar50,auVar50);
                auVar59 = vpermq_avx2(ZEXT1632(auVar50 ^ auVar48),0x55);
                auVar59 = vpackssdw_avx2(auVar42,auVar59);
                auVar50 = vpacksswb_avx(auVar59._16_16_,auVar59._16_16_);
                if ((auVar50 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar60,4);
                }
                auVar50 = vpcmpgtq_avx(auVar56._0_16_ ^ auVar41,auVar51 ^ auVar41);
                auVar50 = vpshufhw_avx(auVar50,0x84);
                auVar59 = vpermq_avx2(ZEXT1632(auVar50 ^ auVar48),0x55);
                auVar59 = vpackssdw_avx2(auVar42,auVar59);
                auVar50 = vpacksswb_avx(auVar59._16_16_,auVar59._16_16_);
                if ((auVar50 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar60,5);
                }
                auVar56 = vpcmpgtq_avx2(auVar56 ^ auVar61,auVar42);
                auVar59 = vpackssdw_avx2(auVar56,auVar56);
                auVar59 = vpackssdw_avx2(auVar56,auVar59 ^ auVar46);
                auVar50 = vpacksswb_avx(auVar59._16_16_,auVar59._16_16_);
                auVar57 = ZEXT1664(auVar50);
                if ((auVar50 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar60,6);
                }
                auVar59 = vpackssdw_avx2(auVar56,auVar56);
                auVar59 = vpackssdw_avx2(auVar59 ^ auVar46,auVar59 ^ auVar46);
                auVar50 = vpacksswb_avx(auVar59._16_16_,auVar59._16_16_);
                if ((auVar50 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  vpextrw_avx(auVar60,7);
                }
                uVar30 = uVar30 + 0x10;
                auVar43 = vpaddd_avx2(auVar43,local_218);
                auVar11 = vpaddd_avx2(auVar11,local_218);
              } while ((s2Len + 0xfU & 0xfffffff0) != uVar30);
              alVar14 = (__m256i)vpsubsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar44);
              palVar21 = ptr_03 + (uVar35 - 1);
              auVar57 = ZEXT3264(CONCAT230(sVar15,CONCAT228(sVar15,CONCAT226(sVar15,CONCAT224(sVar15
                                                  ,CONCAT222(sVar15,CONCAT220(sVar15,CONCAT218(
                                                  sVar15,CONCAT216(sVar15,CONCAT214(sVar15,CONCAT212
                                                  (sVar15,CONCAT210(sVar15,CONCAT28(sVar15,CONCAT26(
                                                  sVar15,CONCAT24(sVar15,CONCAT22(sVar15,sVar15)))))
                                                  )))))))))));
              uVar30 = size;
              do {
                *palVar21 = alVar14;
                alVar14 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar14,auVar45);
                auVar43 = vpminsw_avx2(auVar57._0_32_,(undefined1  [32])alVar14);
                auVar57 = ZEXT3264(auVar43);
                palVar21 = palVar21 + -1;
                iVar23 = (int)uVar30;
                uVar22 = iVar23 - 1;
                uVar30 = (ulong)uVar22;
              } while (uVar22 != 0 && 0 < iVar23);
              lVar27 = size * uVar20;
              auVar11._2_2_ = uVar38;
              auVar11._0_2_ = uVar38;
              auVar11._4_2_ = uVar38;
              auVar11._6_2_ = uVar38;
              auVar11._8_2_ = uVar38;
              auVar11._10_2_ = uVar38;
              auVar11._12_2_ = uVar38;
              auVar11._14_2_ = uVar38;
              auVar11._16_2_ = uVar38;
              auVar11._18_2_ = uVar38;
              auVar11._20_2_ = uVar38;
              auVar11._22_2_ = uVar38;
              auVar11._24_2_ = uVar38;
              auVar11._26_2_ = uVar38;
              auVar11._28_2_ = uVar38;
              auVar11._30_2_ = uVar38;
              auVar43 = vpcmpeqw_avx2(auVar11,_DAT_00908e80);
              auVar59._2_2_ = uVar37;
              auVar59._0_2_ = uVar37;
              auVar59._4_2_ = uVar37;
              auVar59._6_2_ = uVar37;
              auVar59._8_2_ = uVar37;
              auVar59._10_2_ = uVar37;
              auVar59._12_2_ = uVar37;
              auVar59._14_2_ = uVar37;
              auVar59._16_2_ = uVar37;
              auVar59._18_2_ = uVar37;
              auVar59._20_2_ = uVar37;
              auVar59._22_2_ = uVar37;
              auVar59._24_2_ = uVar37;
              auVar59._26_2_ = uVar37;
              auVar59._28_2_ = uVar37;
              auVar59._30_2_ = uVar37;
              auVar47 = ZEXT3264(auVar59);
              auVar65 = ZEXT3264(auVar59);
              local_2a0 = 0;
              uVar30 = 0;
              local_2b4 = iVar18;
              do {
                alVar14 = ptr_02[uVar35 - 1];
                auVar48 = alVar14._0_16_;
                auVar56._0_16_ = ZEXT116(0) * auVar48 + ZEXT116(1) * auVar48;
                auVar56._16_16_ = ZEXT116(0) * alVar14._16_16_ + ZEXT116(1) * auVar48;
                auVar11 = vpalignr_avx2((undefined1  [32])alVar14,auVar56,0xe);
                auVar48 = vpinsrw_avx(auVar11._0_16_,(uint)(ushort)ptr_00[uVar30],0);
                auVar11 = vpblendd_avx2(auVar11,ZEXT1632(auVar48),0xf);
                iVar23 = ppVar5->mapper[(byte)s2[uVar30]];
                auVar53 = vpsubsw_avx2(auVar59,(undefined1  [32])*ptr_03);
                lVar28 = 0;
                auVar61 = auVar59;
                do {
                  auVar56 = vpaddsw_avx2(auVar11,*(undefined1 (*) [32])
                                                  ((long)pvVar4 +
                                                  lVar28 + size * (long)iVar23 * 0x20));
                  auVar11 = *(undefined1 (*) [32])((long)*ptr_02 + lVar28);
                  auVar55 = vpsubsw_avx2(*(undefined1 (*) [32])((long)*ptr + lVar28),auVar45);
                  auVar40 = vpsubsw_avx2(auVar11,auVar44);
                  auVar55 = vpmaxsw_avx2(auVar55,auVar40);
                  auVar53 = vpaddsw_avx2(auVar53,*(undefined1 (*) [32])((long)*ptr_03 + lVar28));
                  auVar61 = vpmaxsw_avx2(auVar53,auVar61);
                  auVar53 = vpmaxsw_avx2(auVar55,auVar56);
                  *(undefined1 (*) [32])((long)*ptr + lVar28) = auVar55;
                  *(undefined1 (*) [32])((long)*ptr_01 + lVar28) = auVar53;
                  lVar28 = lVar28 + 0x20;
                } while (size << 5 != lVar28);
                auVar54._0_16_ = ZEXT116(0) * auVar53._0_16_ + ZEXT116(1) * auVar61._0_16_;
                auVar54._16_16_ = ZEXT116(0) * auVar61._16_16_ + ZEXT116(1) * auVar53._0_16_;
                auVar11 = vpalignr_avx2(auVar53,auVar54,0xe);
                uVar1 = uVar30 + 1;
                auVar48 = vpinsrw_avx(auVar11._0_16_,(uint)(ushort)ptr_00[uVar30 + 1],0);
                auVar53 = vpblendd_avx2(auVar11,ZEXT1632(auVar48),0xf);
                auVar11 = vpaddsw_avx2(auVar53,(undefined1  [32])*ptr_03);
                auVar11 = vpmaxsw_avx2(auVar11,auVar61);
                iVar23 = 0xe;
                do {
                  auVar61 = vperm2i128_avx2(auVar11,auVar11,0x28);
                  auVar61 = vpalignr_avx2(auVar11,auVar61,0xe);
                  auVar61 = vpaddsw_avx2(auVar61,auVar39);
                  auVar11 = vpmaxsw_avx2(auVar61,auVar11);
                  iVar23 = iVar23 + -1;
                } while (iVar23 != 0);
                auVar61 = vperm2i128_avx2(auVar11,auVar11,0x28);
                auVar11 = vpalignr_avx2(auVar11,auVar61,0xe);
                auVar11 = vpaddsw_avx2(auVar11,ZEXT432(uVar34 & 0xffff));
                auVar61 = vpmaxsw_avx2(auVar53,auVar11);
                lVar29 = 0;
                lVar28 = local_2a0;
                do {
                  auVar11 = vpsubsw_avx2(auVar11,auVar45);
                  auVar61 = vpsubsw_avx2(auVar61,auVar44);
                  auVar11 = vpmaxsw_avx2(auVar61,auVar11);
                  auVar61 = vpmaxsw_avx2(auVar11,*(undefined1 (*) [32])((long)*ptr_01 + lVar29));
                  *(undefined1 (*) [32])((long)*ptr_02 + lVar29) = auVar61;
                  piVar6 = ((ppVar19->field_4).rowcols)->score_row;
                  *(int *)((long)piVar6 + lVar28) = (int)auVar61._0_2_;
                  auVar48 = auVar61._0_16_;
                  uVar32 = vpextrw_avx(auVar48,1);
                  *(int *)((long)piVar6 + lVar27 * 4 + lVar28) = (int)(short)uVar32;
                  uVar32 = vpextrw_avx(auVar48,2);
                  *(int *)((long)piVar6 + lVar27 * 8 + lVar28) = (int)(short)uVar32;
                  uVar32 = vpextrw_avx(auVar48,3);
                  *(int *)((long)piVar6 + lVar27 * 0xc + lVar28) = (int)(short)uVar32;
                  uVar32 = vpextrw_avx(auVar48,4);
                  *(int *)((long)piVar6 + lVar27 * 0x10 + lVar28) = (int)(short)uVar32;
                  uVar32 = vpextrw_avx(auVar48,5);
                  *(int *)((long)piVar6 + lVar27 * 0x14 + lVar28) = (int)(short)uVar32;
                  uVar32 = vpextrw_avx(auVar48,6);
                  *(int *)((long)piVar6 + lVar27 * 0x18 + lVar28) = (int)(short)uVar32;
                  uVar32 = vpextrw_avx(auVar48,7);
                  *(int *)((long)piVar6 + lVar27 * 0x1c + lVar28) = (int)(short)uVar32;
                  auVar48 = auVar61._16_16_;
                  *(int *)((long)piVar6 + lVar27 * 0x20 + lVar28) = (int)auVar61._16_2_;
                  uVar32 = vpextrw_avx(auVar48,1);
                  *(int *)((long)piVar6 + lVar27 * 0x24 + lVar28) = (int)(short)uVar32;
                  uVar32 = vpextrw_avx(auVar48,2);
                  *(int *)((long)piVar6 + lVar27 * 0x28 + lVar28) = (int)(short)uVar32;
                  uVar32 = vpextrw_avx(auVar48,3);
                  *(int *)((long)piVar6 + lVar27 * 0x2c + lVar28) = (int)(short)uVar32;
                  uVar32 = vpextrw_avx(auVar48,4);
                  *(int *)((long)piVar6 + lVar27 * 0x30 + lVar28) = (int)(short)uVar32;
                  uVar32 = vpextrw_avx(auVar48,5);
                  *(int *)((long)piVar6 + lVar27 * 0x34 + lVar28) = (int)(short)uVar32;
                  uVar32 = vpextrw_avx(auVar48,6);
                  *(int *)((long)piVar6 + lVar27 * 0x38 + lVar28) = (int)(short)uVar32;
                  uVar32 = vpextrw_avx(auVar48,7);
                  *(int *)((long)piVar6 + lVar27 * 0x3c + lVar28) = (int)(short)uVar32;
                  auVar53 = vpminsw_avx2(auVar57._0_32_,auVar11);
                  auVar56 = vpminsw_avx2(auVar61,auVar53);
                  auVar57 = ZEXT3264(auVar56);
                  auVar53 = vpmaxsw_avx2(auVar61,auVar65._0_32_);
                  auVar65 = ZEXT3264(auVar53);
                  lVar29 = lVar29 + 0x20;
                  lVar28 = lVar28 + uVar20 * 4;
                } while (size << 5 != lVar29);
                auVar11 = vpcmpgtw_avx2((undefined1  [32])ptr_02[uVar7],auVar47._0_32_);
                auVar11 = vpand_avx2(auVar11,auVar43);
                auVar61 = vpmaxsw_avx2((undefined1  [32])ptr_02[uVar7],auVar47._0_32_);
                auVar48 = auVar61._16_16_;
                auVar47 = ZEXT3264(auVar61);
                local_298 = (int)uVar30;
                if ((((((((((((((((((((((((((((((((auVar11 >> 7 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0 ||
                                                 (auVar11 >> 0xf & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar11 >> 0x17 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar11 >> 0x1f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar11 >> 0x27 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar11 >> 0x2f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar11 >> 0x37 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar11 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar11 >> 0x47 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar11 >> 0x4f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar11 >> 0x57 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar11 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar11 >> 0x67 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar11 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar11 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar11 >> 0x7f,0) != '\0') ||
                                  (auVar11 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar11 >> 0x8f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar11 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar11 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar11 >> 0xa7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar11 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar11 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar11 >> 0xbf,0) != '\0') ||
                          (auVar11 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar11 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar11 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar11 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar11 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar11 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar11 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    auVar11[0x1f] < '\0') {
                  local_2b4 = local_298;
                }
                local_2a0 = local_2a0 + 4;
                uVar30 = uVar1;
              } while (uVar1 != uVar20);
              if (s2_end != 0) {
                if (iVar17 < 0xf) {
                  iVar23 = 0;
                  do {
                    auVar43 = auVar47._0_32_;
                    auVar39 = vperm2i128_avx2(auVar43,auVar43,0x28);
                    auVar39 = vpalignr_avx2(auVar43,auVar39,0xe);
                    auVar48 = auVar39._16_16_;
                    auVar47 = ZEXT3264(auVar39);
                    iVar23 = iVar23 + 1;
                  } while (iVar23 < iVar31);
                }
                uVar34 = vpextrw_avx(auVar48,7);
              }
              sVar33 = (short)uVar34;
              uVar22 = uVar16;
              if ((s1_end != 0) && ((uVar25 & 0x7ffffff0) != 0)) {
                uVar25 = 0;
                do {
                  uVar26 = ((uint)uVar25 & 0xf) * uVar35 + ((uint)(uVar25 >> 4) & 0xfffffff);
                  if ((int)uVar26 < (int)uVar3) {
                    uVar2 = *(ushort *)((long)*ptr_02 + uVar25 * 2);
                    if ((short)(ushort)uVar34 < (short)uVar2) {
                      uVar34 = (uint)uVar2;
                      uVar22 = uVar26;
                      local_2b4 = iVar18;
                    }
                    else {
                      if ((int)uVar22 <= (int)uVar26) {
                        uVar26 = uVar22;
                      }
                      if (local_2b4 != iVar18) {
                        uVar26 = uVar22;
                      }
                      if (uVar2 == (ushort)uVar34) {
                        uVar22 = uVar26;
                      }
                    }
                  }
                  sVar33 = (short)uVar34;
                  uVar25 = uVar25 + 1;
                } while ((uVar35 & 0x7ffffff) << 4 != (int)uVar25);
              }
              if (s2_end == 0 && s1_end == 0) {
                alVar14 = ptr_02[uVar7];
                auVar48 = alVar14._16_16_;
                if (iVar17 < 0xf) {
                  iVar23 = 0;
                  do {
                    auVar39 = vperm2i128_avx2((undefined1  [32])alVar14,(undefined1  [32])alVar14,
                                              0x28);
                    alVar14 = (__m256i)vpalignr_avx2((undefined1  [32])alVar14,auVar39,0xe);
                    auVar48 = alVar14._16_16_;
                    iVar23 = iVar23 + 1;
                  } while (iVar23 < iVar31);
                }
                uVar32 = vpextrw_avx(auVar48,7);
                sVar33 = (short)uVar32;
                uVar22 = uVar16;
                local_2b4 = iVar18;
              }
              auVar39 = vpcmpgtw_avx2(auVar59,auVar56);
              auVar58._2_2_ = sVar15;
              auVar58._0_2_ = sVar15;
              auVar58._4_2_ = sVar15;
              auVar58._6_2_ = sVar15;
              auVar58._8_2_ = sVar15;
              auVar58._10_2_ = sVar15;
              auVar58._12_2_ = sVar15;
              auVar58._14_2_ = sVar15;
              auVar58._16_2_ = sVar15;
              auVar58._18_2_ = sVar15;
              auVar58._20_2_ = sVar15;
              auVar58._22_2_ = sVar15;
              auVar58._24_2_ = sVar15;
              auVar58._26_2_ = sVar15;
              auVar58._28_2_ = sVar15;
              auVar58._30_2_ = sVar15;
              auVar43 = vpcmpgtw_avx2(auVar53,auVar58);
              auVar39 = vpor_avx2(auVar43,auVar39);
              if ((((((((((((((((((((((((((((((((auVar39 >> 7 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0 ||
                                               (auVar39 >> 0xf & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar39 >> 0x17 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar39 >> 0x1f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar39 >> 0x27 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar39 >> 0x2f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar39 >> 0x37 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar39 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar39 >> 0x47 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar39 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar39 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar39 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar39 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar39 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar39 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar39 >> 0x7f,0) != '\0') ||
                                (auVar39 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar39 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar39 >> 0x97 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar39 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar39 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar39 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar39 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar39 >> 0xbf,0) != '\0') ||
                        (auVar39 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar39 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar39 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar39 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar39 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar39 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar39 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  auVar39[0x1f] < '\0') {
                *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
                sVar33 = 0;
                local_2b4 = 0;
                uVar22 = 0;
              }
              ppVar19->score = (int)sVar33;
              ppVar19->end_query = uVar22;
              ppVar19->end_ref = local_2b4;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar19;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m256i vZero;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile16.score;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi16(_mm256_set1_epi16(position),
            _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15));
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi16_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi16(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int16_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_16_t h;
            __m256i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_subs_epi16(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 2);
        vHp = _mm256_insert_epi16_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vE, vGapE),
                    _mm256_subs_epi16(vH, vGapO));
            vHp = _mm256_adds_epi16(vHp, vW);
            vF = _mm256_max_epi16(vF, _mm256_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm256_max_epi16(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 2);
        vHt = _mm256_insert_epi16_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi16(vF, _mm256_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 2);
            vFt = _mm256_adds_epi16(vFt, vSegLenXgap);
            vF = _mm256_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 2);
        vF = _mm256_adds_epi16(vF, vNegInfFront);
        vH = _mm256_max_epi16(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vF, vGapE),
                    _mm256_subs_epi16(vH, vGapO));
            vH = _mm256_max_epi16(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m256i vCompare;
            vH = _mm256_load_si256(pvH + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi16(vH, vMaxH));
            vMaxH = _mm256_max_epi16(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 2);
        }
        score = (int16_t) _mm256_extract_epi16_rpl(vMaxH, 15);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            score = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}